

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O2

void __thiscall Memory::initialize(Memory *this,DATA_PATTERN data_pattern)

{
  int iVar1;
  int iVar2;
  uint64_t cur_page;
  ulong uVar3;
  int iVar4;
  uint64_t cur_pageoffset;
  ulong uVar5;
  string local_60;
  Memory *local_40;
  allocator<char> local_31;
  
  local_40 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Initializing memory with pseudorandom sequence.",&local_31);
  Logger::log_info(&local_60,true);
  std::__cxx11::string::~string((string *)&local_60);
  iVar4 = (int)(char)data_pattern;
  for (uVar3 = 0; uVar3 < local_40->size; uVar3 = uVar3 + (long)iVar1) {
    iVar1 = getpagesize();
    srand(iVar1 * (int)uVar3);
    for (uVar5 = 0; uVar5 < (ulong)(long)iVar1; uVar5 = uVar5 + 4) {
      iVar2 = iVar4;
      if (data_pattern != ZEROES) {
        if (iVar4 == 1) {
          iVar2 = 1;
        }
        else if (iVar4 == 2) {
          iVar2 = rand();
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_60,
                     "Could not initialize memory with given (unknown) DATA_PATTERN.",&local_31);
          Logger::log_error(&local_60,true);
          std::__cxx11::string::~string((string *)&local_60);
          iVar2 = 0;
        }
      }
      *(int *)(local_40->start_address + uVar5 + uVar3) = iVar2;
    }
  }
  return;
}

Assistant:

void Memory::initialize(DATA_PATTERN data_pattern) {
  Logger::log_info("Initializing memory with pseudorandom sequence.");

  // for each page in the address space [start, end]
  for (uint64_t cur_page = 0; cur_page < size; cur_page += getpagesize()) {
    // reseed rand to have a sequence of reproducible numbers, using this we can compare the initialized values with
    // those after hammering to see whether bit flips occurred
    srand(static_cast<unsigned int>(cur_page*getpagesize()));
    for (uint64_t cur_pageoffset = 0; cur_pageoffset < (uint64_t) getpagesize(); cur_pageoffset += sizeof(int)) {

      int fill_value = 0;
      if (data_pattern == DATA_PATTERN::RANDOM) {
        fill_value = rand();
      } else if (data_pattern == DATA_PATTERN::ZEROES) {
        fill_value = 0;
      } else if (data_pattern == DATA_PATTERN::ONES) {
        fill_value = 1;
      } else {
        Logger::log_error("Could not initialize memory with given (unknown) DATA_PATTERN.");
      }
        
      // write (pseudo)random 4 bytes
      uint64_t offset = cur_page + cur_pageoffset;
      *((int *) (start_address + offset)) = fill_value;
    }
  }
}